

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

void __thiscall PF_BufferMgr::PF_BufferMgr(PF_BufferMgr *this,int _numPages)

{
  undefined1 auVar1 [16];
  StatisticsMgr *this_00;
  ulong uVar2;
  PF_BufPageDesc *pPVar3;
  char *pcVar4;
  int local_28;
  int i;
  int _numPages_local;
  PF_BufferMgr *this_local;
  
  PF_HashTable::PF_HashTable(&this->hashTable,0x14);
  this->numPages = _numPages;
  this->pageSize = 0x1000;
  this_00 = (StatisticsMgr *)operator_new(0x28);
  StatisticsMgr::StatisticsMgr(this_00);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->numPages;
  uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pStatisticsMgr = this_00;
  pPVar3 = (PF_BufPageDesc *)operator_new__(uVar2);
  this->bufTable = pPVar3;
  local_28 = 0;
  while( true ) {
    if (this->numPages <= local_28) {
      this->bufTable[this->numPages + -1].next = -1;
      this->bufTable->prev = -1;
      this->free = 0;
      this->last = -1;
      this->first = -1;
      return;
    }
    uVar2 = (ulong)this->pageSize;
    if ((long)uVar2 < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pcVar4 = (char *)operator_new__(uVar2);
    this->bufTable[local_28].pData = pcVar4;
    if (pcVar4 == (char *)0x0) break;
    memset(this->bufTable[local_28].pData,0,(long)this->pageSize);
    this->bufTable[local_28].prev = local_28 + -1;
    this->bufTable[local_28].next = local_28 + 1;
    local_28 = local_28 + 1;
  }
  std::operator<<((ostream *)&std::cerr,"Not enough memory for buffer\n");
  exit(1);
}

Assistant:

PF_BufferMgr::PF_BufferMgr(int _numPages) : hashTable(PF_HASH_TBL_SIZE)
{
   // Initialize local variables
   this->numPages = _numPages;
   pageSize = PF_PAGE_SIZE + sizeof(PF_PageHdr);

#ifdef PF_STATS
   // Initialize the global variable for the statistics manager
   pStatisticsMgr = new StatisticsMgr();
#endif

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Creating buffer manager. %d pages of size %d.\n",
         numPages, PF_PAGE_SIZE+sizeof(PF_PageHdr));
   WriteLog(psMessage);
#endif

   // Allocate memory for buffer page description table
   bufTable = new PF_BufPageDesc[numPages];

   // Initialize the buffer table and allocate memory for buffer pages.
   // Initially, the free list contains all pages
   for (int i = 0; i < numPages; i++) {
      if ((bufTable[i].pData = new char[pageSize]) == NULL) {
         cerr << "Not enough memory for buffer\n";
         exit(1);
      }

      memset ((void *)bufTable[i].pData, 0, pageSize);

      bufTable[i].prev = i - 1;
      bufTable[i].next = i + 1;
   }
   bufTable[0].prev = bufTable[numPages - 1].next = INVALID_SLOT;
   free = 0;
   first = last = INVALID_SLOT;

#ifdef PF_LOG
   WriteLog("Succesfully created the buffer manager.\n");
#endif
}